

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcole.c
# Opt level: O0

int ffgcle(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          long elemincre,int nultyp,float nulval,float *array,char *nularray,int *anynul,int *status
          )

{
  int iVar1;
  uint in_ESI;
  size_t in_R8;
  long in_R9;
  fitsfile *output;
  fitsfile *values;
  float in_XMM0_Da;
  int in_stack_00000008;
  long in_stack_00000010;
  void *in_stack_00000018;
  fitsfile *in_stack_00000020;
  fitsfile *in_stack_00000028;
  void *buffer;
  double cbuff [3600];
  char snull [20];
  char message [81];
  char tform [20];
  LONGLONG maxelem;
  LONGLONG rowincre;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG tnull;
  LONGLONG readptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  int readcheck;
  int nulcheck;
  int convert;
  long ntodo;
  long xwidth;
  long ii;
  long incre;
  long twidth;
  int decimals;
  int xcode;
  int hdutype;
  int maxelem2;
  int tcode;
  double dtemp;
  double power;
  double zero;
  double scale;
  fitsfile *incre_00;
  long *nvals;
  fitsfile *fptr_00;
  fitsfile *fptr_01;
  long *nullarray;
  long *plVar2;
  long *zero_00;
  long *status_00;
  long *buffer_00;
  float *input;
  fitsfile *fptr_02;
  int *status_01;
  fitsfile *fptr_03;
  size_t local_72b8;
  size_t local_72a8;
  size_t local_7298;
  long *nullarray_00;
  fitsfile *pfVar3;
  fitsfile *snull_00;
  fitsfile *status_02;
  double *input_00;
  fitsfile *in_stack_ffffffffffff8da8;
  int *in_stack_ffffffffffff8db0;
  char *in_stack_ffffffffffff8db8;
  double *in_stack_ffffffffffff8dc0;
  double *in_stack_ffffffffffff8dc8;
  char *in_stack_ffffffffffff8dd0;
  long *in_stack_ffffffffffff8dd8;
  int *in_stack_ffffffffffff8de0;
  float *in_stack_ffffffffffff8de8;
  LONGLONG *in_stack_ffffffffffff8df0;
  LONGLONG *in_stack_ffffffffffff8df8;
  long *in_stack_ffffffffffff8e00;
  LONGLONG *in_stack_ffffffffffff8e08;
  LONGLONG *in_stack_ffffffffffff8e10;
  int *in_stack_ffffffffffff8e18;
  LONGLONG *in_stack_ffffffffffff8e20;
  char *in_stack_ffffffffffff8e28;
  int *in_stack_ffffffffffff8e30;
  char local_1d8 [32];
  char local_1b8 [96];
  fitsfile local_158 [2];
  size_t local_138;
  long local_130;
  long local_128;
  size_t local_120;
  long local_118;
  long local_110;
  fitsfile local_108;
  long local_f8;
  long local_f0;
  long local_e8;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  size_t local_d0;
  long local_c0;
  long local_b8;
  long local_b0;
  int local_a4;
  float local_9c;
  undefined1 local_98 [8];
  FITSfile *local_90;
  double local_88;
  double local_80;
  FITSfile *local_78;
  float local_6c;
  long local_68;
  size_t local_60;
  uint local_44;
  int local_34;
  
  local_88 = 1.0;
  local_dc = 0;
  if ((in_stack_00000028->HDUposition < 1) && (in_R8 != 0)) {
    input_00 = (double *)&stack0xffffffffffff8da8;
    if (in_stack_00000020 != (fitsfile *)0x0) {
      in_stack_00000020->HDUposition = 0;
    }
    local_6c = in_XMM0_Da;
    local_68 = in_R9;
    local_60 = in_R8;
    local_44 = in_ESI;
    if (in_stack_00000008 == 2) {
      memset(in_stack_00000018,0,in_R8);
    }
    if (local_68 < 0) {
      local_dc = 0xffffffff;
    }
    incre_00 = local_158;
    status_01 = (int *)local_1d8;
    output = (fitsfile *)&local_78;
    values = (fitsfile *)&local_80;
    nvals = &local_b0;
    fptr_00 = (fitsfile *)(local_98 + 4);
    fptr_01 = (fitsfile *)local_98;
    nullarray = &local_f0;
    plVar2 = &local_f8;
    zero_00 = &local_b8;
    status_00 = &local_e8;
    buffer_00 = &local_110;
    input = &local_9c;
    fptr_02 = &local_108;
    fptr_03 = in_stack_00000028;
    nullarray_00 = nvals;
    pfVar3 = fptr_00;
    snull_00 = fptr_01;
    status_02 = in_stack_00000028;
    iVar1 = ffgcprll(in_stack_ffffffffffff8da8,(int)((ulong)input_00 >> 0x20),
                     (LONGLONG)in_stack_00000028,(LONGLONG)fptr_01,(LONGLONG)fptr_00,
                     (int)((ulong)nvals >> 0x20),in_stack_ffffffffffff8dc0,in_stack_ffffffffffff8dc8
                     ,in_stack_ffffffffffff8dd0,in_stack_ffffffffffff8dd8,in_stack_ffffffffffff8de0,
                     (int *)in_stack_ffffffffffff8de8,in_stack_ffffffffffff8df0,
                     in_stack_ffffffffffff8df8,in_stack_ffffffffffff8e00,in_stack_ffffffffffff8e08,
                     in_stack_ffffffffffff8e10,in_stack_ffffffffffff8e18,in_stack_ffffffffffff8e20,
                     in_stack_ffffffffffff8e28,in_stack_ffffffffffff8e30);
    if (iVar1 < 1) {
      local_138 = (size_t)(int)local_98._0_4_;
      local_b8 = local_68 * local_b8;
      if (local_98._4_4_ == 0x10) {
        ffasfm(in_stack_ffffffffffff8db8,in_stack_ffffffffffff8db0,(long *)in_stack_ffffffffffff8da8
               ,(int *)input_00,&status_02->HDUposition);
        for (local_c0 = 0; local_c0 < local_a4; local_c0 = local_c0 + 1) {
          local_88 = local_88 * 10.0;
        }
      }
      local_d8 = in_stack_00000008;
      if (((in_stack_00000008 != 1) || (local_6c != 0.0)) || (NAN(local_6c))) {
        if (((int)local_98._4_4_ % 10 == 1) && (local_108._0_8_ == 0x4995cdd1)) {
          local_d8 = 0;
        }
        else if ((local_98._4_4_ == 0x15) &&
                ((0x7fff < (long)local_108._0_8_ || ((long)local_108._0_8_ < -0x8000)))) {
          local_d8 = 0;
        }
        else if ((local_98._4_4_ == 0xb) &&
                ((0xff < (long)local_108._0_8_ || ((long)local_108._0_8_ < 0)))) {
          local_d8 = 0;
        }
        else if ((local_98._4_4_ == 0x10) && (local_1d8[0] == '\x01')) {
          local_d8 = 0;
        }
      }
      else {
        local_d8 = 0;
      }
      local_d4 = 1;
      if (local_98._4_4_ == 0x2a) {
        if ((long)local_60 < 0x1fffffff) {
          local_138 = local_60;
        }
        else {
          local_138 = 0x1fffffff;
        }
        if ((((local_d8 == 0) && ((double)local_78 == 1.0)) && (!NAN((double)local_78))) &&
           ((local_80 == 0.0 && (!NAN(local_80))))) {
          local_d4 = 0;
        }
      }
      local_120 = local_60;
      local_128 = 0;
      local_118 = 0;
      while (local_120 != 0) {
        if ((long)local_120 < (long)local_138) {
          local_7298 = local_120;
        }
        else {
          local_7298 = local_138;
        }
        if (local_68 < 0) {
          if ((long)local_7298 < local_f8 / -local_68 + 1) {
            local_72b8 = local_7298;
          }
          else {
            local_72b8 = local_f8 / -local_68 + 1;
          }
          local_d0 = local_72b8;
        }
        else {
          if ((long)local_7298 < ((local_e8 - local_f8) + -1) / local_68 + 1) {
            local_72a8 = local_7298;
          }
          else {
            local_72a8 = ((local_e8 - local_f8) + -1) / local_68 + 1;
          }
          local_d0 = local_72a8;
        }
        local_108.Fptr =
             (FITSfile *)(local_f0 + local_118 * local_110 + local_f8 * (local_b8 / local_68));
        if (local_98._4_4_ == 0xb) {
          ffgi1b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(uchar *)values,
                 &output->HDUposition);
          output = (fitsfile *)(in_stack_00000010 + local_128 * 4);
          values = in_stack_00000028;
          fffi1r4((uchar *)input_00,local_d0,(double)local_78,local_80,local_d8,
                  (uchar)local_108.HDUposition,local_6c,
                  (char *)((long)in_stack_00000018 + local_128),&in_stack_00000020->HDUposition,
                  (float *)output,&in_stack_00000028->HDUposition);
        }
        else if (local_98._4_4_ == 0x10) {
          ffmbyt(fptr_00,(LONGLONG)nvals,(int)((ulong)incre_00 >> 0x20),&values->HDUposition);
          if (local_b8 == local_b0) {
            ffgbyt(fptr_02,(LONGLONG)input,buffer_00,(int *)status_00);
          }
          else {
            ffgbytoff(fptr_03,(long)status_01,(long)fptr_02,(long)input,buffer_00,(int *)status_00);
          }
          values = (fitsfile *)(in_stack_00000010 + local_128 * 4);
          output = in_stack_00000020;
          incre_00 = in_stack_00000028;
          fffstrr4((char *)in_stack_ffffffffffff8dc8,(long)in_stack_ffffffffffff8dc0,
                   (double)in_stack_ffffffffffff8db8,(double)in_stack_ffffffffffff8db0,
                   (long)in_stack_ffffffffffff8da8,(double)input_00,(int)((ulong)status_02 >> 0x20),
                   (char *)snull_00,(float)((ulong)pfVar3 >> 0x20),(char *)nullarray_00,
                   in_stack_ffffffffffff8de0,in_stack_ffffffffffff8de8,
                   (int *)in_stack_ffffffffffff8df0);
        }
        else if (local_98._4_4_ == 0x15) {
          ffgi2b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(short *)values,
                 &output->HDUposition);
          output = (fitsfile *)(in_stack_00000010 + local_128 * 4);
          values = in_stack_00000028;
          fffi2r4((short *)input_00,local_d0,(double)local_78,local_80,local_d8,
                  (short)local_108.HDUposition,local_6c,
                  (char *)((long)in_stack_00000018 + local_128),&in_stack_00000020->HDUposition,
                  (float *)output,&in_stack_00000028->HDUposition);
        }
        else if (local_98._4_4_ == 0x29) {
          ffgi4b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,&values->HDUposition,
                 &output->HDUposition);
          output = (fitsfile *)(in_stack_00000010 + local_128 * 4);
          values = in_stack_00000028;
          fffi4r4((int *)input_00,local_d0,(double)local_78,local_80,local_d8,local_108.HDUposition,
                  local_6c,(char *)((long)in_stack_00000018 + local_128),
                  &in_stack_00000020->HDUposition,(float *)output,&in_stack_00000028->HDUposition);
        }
        else if (local_98._4_4_ == 0x2a) {
          ffgr4b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(float *)values,
                 &output->HDUposition);
          if (local_d4 != 0) {
            output = in_stack_00000028;
            fffr4r4(input,(long)buffer_00,(double)status_00,(double)zero_00,
                    (int)((ulong)plVar2 >> 0x20),SUB84(plVar2,0),(char *)nullarray,
                    &fptr_01->HDUposition,(float *)fptr_00,status_01);
          }
        }
        else if (local_98._4_4_ == 0x51) {
          ffgi8b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(long *)values,
                 &output->HDUposition);
          output = (fitsfile *)(in_stack_00000010 + local_128 * 4);
          values = in_stack_00000028;
          fffi8r4((LONGLONG *)input_00,local_d0,(double)local_78,local_80,local_d8,local_108._0_8_,
                  local_6c,(char *)((long)in_stack_00000018 + local_128),
                  &in_stack_00000020->HDUposition,(float *)output,&in_stack_00000028->HDUposition);
        }
        else {
          if (local_98._4_4_ != 0x52) {
            snprintf(local_1b8,0x51,"Cannot read numbers from column %d which has format %s",
                     (ulong)local_44,local_158);
            ffpmsg((char *)0x18c411);
            if (local_9c == 1.4013e-45) {
              in_stack_00000028->HDUposition = 0x137;
              return 0x137;
            }
            in_stack_00000028->HDUposition = 0x138;
            return 0x138;
          }
          ffgr8b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(double *)values,
                 &output->HDUposition);
          output = in_stack_00000028;
          fffr8r4(input_00,local_d0,(double)local_78,local_80,local_d8,local_6c,
                  (char *)((long)in_stack_00000018 + local_128),&in_stack_00000020->HDUposition,
                  (float *)(in_stack_00000010 + local_128 * 4),&in_stack_00000028->HDUposition);
        }
        if (0 < in_stack_00000028->HDUposition) {
          local_90 = (FITSfile *)(double)local_128;
          if ((int)local_9c < 1) {
            snprintf(local_1b8,0x51,"Error reading elements %.0f thru %.0f from image (ffgcle).",
                     (double)local_90 + 1.0,(double)local_90 + (double)(long)local_d0);
          }
          else {
            snprintf(local_1b8,0x51,"Error reading elements %.0f thru %.0f from column %d (ffgcle)."
                     ,(double)local_90 + 1.0,(double)local_90 + (double)(long)local_d0,
                     (ulong)local_44);
          }
          ffpmsg((char *)0x18c521);
          return in_stack_00000028->HDUposition;
        }
        local_120 = local_120 - local_d0;
        if (local_120 != 0) {
          local_128 = local_d0 + local_128;
          local_f8 = local_f8 + local_d0 * local_68;
          if (local_f8 < local_e8) {
            if (local_f8 < 0) {
              local_130 = (-1 - local_f8) / local_e8 + 1;
              local_118 = local_118 - local_130;
              local_f8 = local_130 * local_e8 + local_f8;
            }
          }
          else {
            local_130 = local_f8 / local_e8;
            local_118 = local_130 + local_118;
            local_f8 = local_f8 - local_130 * local_e8;
          }
        }
      }
      if (in_stack_00000028->HDUposition == -0xb) {
        ffpmsg((char *)0x18c694);
        in_stack_00000028->HDUposition = 0x19c;
      }
      local_34 = in_stack_00000028->HDUposition;
    }
    else {
      local_34 = in_stack_00000028->HDUposition;
    }
  }
  else {
    local_34 = in_stack_00000028->HDUposition;
  }
  return local_34;
}

Assistant:

int ffgcle( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  elemincre,  /* I - pixel increment; e.g., 2 = every other  */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            float nulval,     /* I - value for null pixels if nultyp = 1     */
            float *array,     /* O - array of values that are read           */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer be a virtual column in a 1 or more grouped FITS primary
  array or image extension.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The output array of values will be converted from the datatype of the column 
  and will be scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    double scale, zero, power = 1., dtemp;
    int tcode, maxelem2, hdutype, xcode, decimals;
    long twidth, incre;
    long ii, xwidth, ntodo;
    int convert, nulcheck, readcheck = 0;
    LONGLONG repeat, startpos, elemnum, readptr, tnull;
    LONGLONG rowlen, rownum, remain, next, rowincre, maxelem;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value if reading from ASCII table  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    if (anynul)
       *anynul = 0;

    if (nultyp == 2)
        memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (elemincre < 0)
        readcheck = -1;  /* don't do range checking in this case */

    if ( ffgcprll( fptr, colnum, firstrow, firstelem, nelem, readcheck, &scale, &zero,
         tform, &twidth, &tcode, &maxelem2, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0 )
         return(*status);
    maxelem = maxelem2;

    incre *= elemincre;   /* multiply incre to just get every nth pixel */

    if (tcode == TSTRING)    /* setup for ASCII tables */
    {
      /* get the number of implied decimal places if no explicit decmal point */
      ffasfm(tform, &xcode, &xwidth, &decimals, status); 
      for(ii = 0; ii < decimals; ii++)
        power *= 10.;
    }

    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (tcode%10 == 1 &&        /* if reading an integer column, and  */ 
            tnull == NULL_UNDEFINED) /* if a null value is not defined,    */
            nulcheck = 0;            /* then do not check for null values. */

    else if (tcode == TSHORT && (tnull > SHRT_MAX || tnull < SHRT_MIN) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TBYTE && (tnull > 255 || tnull < 0) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TSTRING && snull[0] == ASCII_NULL_UNDEFINED)
         nulcheck = 0;

    /*----------------------------------------------------------------------*/
    /*  If FITS column and output data array have same datatype, then we do */
    /*  not need to use a temporary buffer to store intermediate datatype.  */
    /*----------------------------------------------------------------------*/
    convert = 1;
    if (tcode == TFLOAT) /* Special Case:                        */
    {                             /* no type convertion required, so read */
                                  /* data directly into output buffer.    */

        if (nelem < (LONGLONG)INT32_MAX/4) {
            maxelem = nelem;
        } else {
            maxelem = INT32_MAX/4;
        }

        if (nulcheck == 0 && scale == 1. && zero == 0.)
            convert = 0;  /* no need to scale data or find nulls */
    }

    /*---------------------------------------------------------------------*/
    /*  Now read the pixels from the FITS column. If the column does not   */
    /*  have the same datatype as the output array, then we have to read   */
    /*  the raw values into a temporary buffer (of limited size).  In      */
    /*  the case of a vector colum read only 1 vector of values at a time  */
    /*  then skip to the next row if more values need to be read.          */
    /*  After reading the raw values, then call the fffXXYY routine to (1) */
    /*  test for undefined values, (2) convert the datatype if necessary,  */
    /*  and (3) scale the values by the FITS TSCALn and TZEROn linear      */
    /*  scaling parameters.                                                */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */

    while (remain)
    {
        /* limit the number of pixels to read at one time to the number that
           will fit in the buffer or to the number of pixels that remain in
           the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);
        if (elemincre >= 0)
        {
          ntodo = (long) minvalue(ntodo, ((repeat - elemnum - 1)/elemincre +1));
        }
        else
        {
          ntodo = (long) minvalue(ntodo, (elemnum/(-elemincre) +1));
        }

        readptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * (incre / elemincre));

        switch (tcode) 
        {
            case (TFLOAT):
                ffgr4b(fptr, readptr, ntodo, incre, &array[next], status);
                if (convert)
                    fffr4r4(&array[next], ntodo, scale, zero, nulcheck, 
                           nulval, &nularray[next], anynul, 
                           &array[next], status);
                break;
            case (TBYTE):
                ffgi1b(fptr, readptr, ntodo, incre, (unsigned char *) buffer,
                       status);
                fffi1r4((unsigned char *) buffer, ntodo, scale, zero, nulcheck, 
                    (unsigned char) tnull, nulval, &nularray[next], anynul, 
                     &array[next], status);
                break;
            case (TSHORT):
                ffgi2b(fptr, readptr, ntodo, incre, (short  *) buffer, status);
                fffi2r4((short  *) buffer, ntodo, scale, zero, nulcheck, 
                       (short) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONG):
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) buffer,
                       status);
                fffi4r4((INT32BIT *) buffer, ntodo, scale, zero, nulcheck, 
                       (INT32BIT) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;

            case (TLONGLONG):
                ffgi8b(fptr, readptr, ntodo, incre, (long *) buffer, status);
                fffi8r4( (LONGLONG *) buffer, ntodo, scale, zero, 
                           nulcheck, tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
                break;
            case (TDOUBLE):
                ffgr8b(fptr, readptr, ntodo, incre, (double *) buffer, status);
                fffr8r4((double *) buffer, ntodo, scale, zero, nulcheck, 
                          nulval, &nularray[next], anynul, 
                          &array[next], status);
                break;
            case (TSTRING):
                ffmbyt(fptr, readptr, REPORT_EOF, status);
       
                if (incre == twidth)    /* contiguous bytes */
                     ffgbyt(fptr, ntodo * twidth, buffer, status);
                else
                     ffgbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                fffstrr4((char *) buffer, ntodo, scale, zero, twidth, power,
                     nulcheck, snull, nulval, &nularray[next], anynul,
                     &array[next], status);
                break;


            default:  /*  error trap for invalid column format */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot read numbers from column %d which has format %s",
                    colnum, tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous read operation */
        {
	  dtemp = (double) next;
          if (hdutype > 0)
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from column %d (ffgcle).",
              dtemp+1., dtemp+ntodo, colnum);
          else
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from image (ffgcle).",
              dtemp+1., dtemp+ntodo);

          ffpmsg(message);
          return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum = elemnum + (ntodo * elemincre);

            if (elemnum >= repeat)  /* completed a row; start on later row */
            {
                rowincre = elemnum / repeat;
                rownum += rowincre;
                elemnum = elemnum - (rowincre * repeat);
            }
            else if (elemnum < 0)  /* completed a row; start on a previous row */
            {
                rowincre = (-elemnum - 1) / repeat + 1;
                rownum -= rowincre;
                elemnum = (rowincre * repeat) + elemnum;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while reading FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}